

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iLimit;
  undefined8 *puVar1;
  uint uVar2;
  ZSTD_matchState_t *pZVar3;
  undefined8 uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  int *mEnd;
  BYTE *pBVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  int *piVar14;
  BYTE *pBVar15;
  U32 UVar16;
  ulong uVar17;
  seqDef *psVar18;
  int *iend;
  size_t offbaseFound;
  uint local_a4;
  size_t local_88;
  int *local_80;
  BYTE *local_78;
  BYTE *local_70;
  int *local_68;
  uint local_60;
  uint local_5c;
  BYTE *local_58;
  BYTE *local_50;
  int *local_48;
  uint *local_40;
  BYTE *local_38;
  
  local_70 = (ms->window).base;
  uVar2 = (ms->window).dictLimit;
  uVar5 = (ms->cParams).minMatch;
  uVar9 = 6;
  if (uVar5 < 6) {
    uVar9 = uVar5;
  }
  local_60 = 4;
  if (4 < uVar9) {
    local_60 = uVar9;
  }
  local_78 = local_70 + uVar2;
  local_a4 = *rep;
  pZVar3 = ms->dictMatchState;
  local_80 = (int *)(pZVar3->window).nextSrc;
  local_58 = (pZVar3->window).base;
  local_38 = local_58 + (pZVar3->window).dictLimit;
  uVar5 = ((int)src - ((int)local_78 + (int)local_38)) + (int)local_80;
  piVar12 = (int *)((long)src + (ulong)(uVar5 == 0));
  if (uVar5 < local_a4) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  uVar9 = rep[1];
  if (uVar5 < uVar9) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iLimit = (int *)(srcSize + (long)src);
  local_68 = (int *)((long)src + (srcSize - 8));
  ms->lazySkipping = 0;
  if (piVar12 < local_68) {
    local_5c = ((int)local_58 - (int)local_80) + uVar2;
    local_50 = local_58 + -(ulong)local_5c;
    local_48 = iLimit + -8;
    local_40 = rep;
    do {
      iend = (int *)((long)piVar12 + 1);
      uVar5 = (((int)piVar12 - (int)local_70) - local_a4) + 1;
      piVar14 = (int *)(local_70 + uVar5);
      if (uVar5 < uVar2) {
        piVar14 = (int *)(local_58 + (uVar5 - local_5c));
      }
      if ((uVar5 - uVar2 < 0xfffffffd) && (*piVar14 == *iend)) {
        mEnd = iLimit;
        if (uVar5 < uVar2) {
          mEnd = local_80;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar12 + 5),(BYTE *)(piVar14 + 1),(BYTE *)iLimit,
                           (BYTE *)mEnd,local_78);
        uVar17 = sVar8 + 4;
        UVar16 = 1;
LAB_001dad14:
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001db089:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < seqStore->maxNbLit) {
LAB_001db06a:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar13 = (long)iend - (long)src;
        pBVar15 = seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < pBVar15 + uVar13) {
LAB_001db02c:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (iLimit < iend) {
LAB_001db04b:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_48 < iend) {
          ZSTD_safecopyLiterals(pBVar15,(BYTE *)src,(BYTE *)iend,(BYTE *)local_48);
LAB_001dad88:
          seqStore->lit = seqStore->lit + uVar13;
          if (0xffff < uVar13) {
            if (seqStore->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar15 = *src;
          *(undefined8 *)(pBVar15 + 8) = uVar4;
          pBVar15 = seqStore->lit;
          if (0x10 < uVar13) {
            if ((BYTE *)0xffffffffffffffe0 < pBVar15 + 0x10 + (-0x10 - ((long)src + 0x10))) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar15 + 0x18) = uVar4;
            if (0x20 < (long)uVar13) {
              lVar11 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x20);
                uVar4 = puVar1[1];
                pBVar10 = pBVar15 + lVar11 + 0x20;
                *(undefined8 *)pBVar10 = *puVar1;
                *(undefined8 *)(pBVar10 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar11 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar10 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar10 + 0x18) = uVar4;
                lVar11 = lVar11 + 0x20;
              } while (pBVar10 + 0x20 < pBVar15 + uVar13);
            }
            goto LAB_001dad88;
          }
          seqStore->lit = pBVar15 + uVar13;
        }
        psVar18 = seqStore->sequences;
        psVar18->litLength = (U16)uVar13;
        psVar18->offBase = UVar16;
        if (uVar17 < 3) {
LAB_001db0a8:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar17 - 3) {
          if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001db0c7:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar18->mlBase = (U16)(uVar17 - 3);
        psVar18 = psVar18 + 1;
        seqStore->sequences = psVar18;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        src = (void *)((long)iend + uVar17);
        piVar12 = (int *)src;
        uVar5 = uVar9;
        if (src <= local_68) {
          do {
            uVar6 = local_a4;
            uVar7 = ((int)src - (int)local_70) - uVar5;
            pBVar15 = local_70;
            if (uVar7 < uVar2) {
              pBVar15 = local_50;
            }
            piVar12 = (int *)src;
            uVar9 = uVar5;
            local_a4 = uVar6;
            if ((0xfffffffc < uVar7 - uVar2) || (*(int *)(pBVar15 + uVar7) != *src)) break;
            piVar12 = iLimit;
            if (uVar7 < uVar2) {
              piVar12 = local_80;
            }
            sVar8 = ZSTD_count_2segments
                              ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar15 + uVar7) + 4),
                               (BYTE *)iLimit,(BYTE *)piVar12,local_78);
            if (seqStore->maxNbSeq <= (ulong)((long)psVar18 - (long)seqStore->sequencesStart >> 3))
            goto LAB_001db089;
            if (0x20000 < seqStore->maxNbLit) goto LAB_001db06a;
            pBVar15 = seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < pBVar15) goto LAB_001db02c;
            if (iLimit < src) goto LAB_001db04b;
            if (local_48 < src) {
              ZSTD_safecopyLiterals(pBVar15,(BYTE *)src,(BYTE *)src,(BYTE *)local_48);
            }
            else {
              uVar4 = *(undefined8 *)((long)src + 8);
              *(undefined8 *)pBVar15 = *src;
              *(undefined8 *)(pBVar15 + 8) = uVar4;
            }
            psVar18 = seqStore->sequences;
            psVar18->litLength = 0;
            psVar18->offBase = 1;
            if (sVar8 + 4 < 3) goto LAB_001db0a8;
            if (0xffff < sVar8 + 1) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001db0c7;
              seqStore->longLengthType = ZSTD_llt_matchLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar18->mlBase = (U16)(sVar8 + 1);
            psVar18 = psVar18 + 1;
            seqStore->sequences = psVar18;
            src = (void *)((long)src + sVar8 + 4);
            piVar12 = (int *)src;
            uVar9 = uVar6;
            local_a4 = uVar5;
            uVar5 = uVar6;
          } while (src <= local_68);
        }
      }
      else {
        local_88 = 999999999;
        if (local_60 == 6) {
          uVar17 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                             (ms,(BYTE *)piVar12,(BYTE *)iLimit,&local_88);
        }
        else if (local_60 == 5) {
          uVar17 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                             (ms,(BYTE *)piVar12,(BYTE *)iLimit,&local_88);
        }
        else {
          uVar17 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                             (ms,(BYTE *)piVar12,(BYTE *)iLimit,&local_88);
        }
        uVar13 = local_88;
        piVar14 = piVar12;
        if (uVar17 == 0) {
          uVar13 = 1;
          piVar14 = iend;
        }
        iend = piVar14;
        UVar16 = (U32)uVar13;
        if (3 < uVar17) {
          if (3 < local_88) {
            uVar13 = (long)piVar12 + (-0xfffffffd - (long)(local_70 + local_88));
            pBVar10 = local_70;
            pBVar15 = local_78;
            if ((uint)uVar13 < uVar2) {
              pBVar10 = local_50;
              pBVar15 = local_38;
            }
            if ((src < piVar12) && (uVar13 = uVar13 & 0xffffffff, pBVar15 < pBVar10 + uVar13)) {
              pBVar10 = pBVar10 + uVar13;
              do {
                piVar12 = (int *)((long)iend + -1);
                pBVar10 = pBVar10 + -1;
                if ((*(BYTE *)piVar12 != *pBVar10) ||
                   (uVar17 = uVar17 + 1, iend = piVar12, piVar12 <= src)) break;
              } while (pBVar15 < pBVar10);
            }
            uVar9 = local_a4;
            local_a4 = UVar16 - 3;
          }
          goto LAB_001dad14;
        }
        ms->lazySkipping = (uint)(0x7ff < (ulong)((long)piVar12 - (long)src));
        piVar12 = (int *)((long)piVar12 + ((ulong)((long)piVar12 - (long)src) >> 8) + 1);
      }
      rep = local_40;
    } while (piVar12 < local_68);
  }
  *rep = local_a4;
  rep[1] = uVar9;
  return (long)iLimit - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_greedy_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0, ZSTD_dedicatedDictSearch);
}